

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrand.c
# Opt level: O0

void mt_srand(uint seed)

{
  uint *local_20;
  uint *s;
  int local_10;
  uint x;
  int j;
  uint seed_local;
  
  s._4_4_ = seed | 1;
  left = 0;
  local_20 = state;
  state[0] = s._4_4_;
  for (local_10 = 0x270; local_20 = local_20 + 1, 1 < local_10; local_10 = local_10 + -1) {
    s._4_4_ = s._4_4_ * 0x10dcd;
    *local_20 = s._4_4_;
  }
  return;
}

Assistant:

void mt_srand(unsigned int seed)
{
    /* We initialize state[0..(N-1)] via the generator
     *
     *   x_new = (69069 * x_old) mod 2^32
     *
     * from Line 15 of Table 1, p. 106, Sec. 3.3.4 of Knuth's
     * _The Art of Computer Programming_, Volume 2, 3rd ed. */
    int j;
    unsigned int x = (seed | 1) & 0xFFFFFFFF;
    unsigned int *s = state;

    left = 0;
    *s++ = x;
    for (j = N; j > 1; --j)
	 *s++ = (x*=69069U) & 0xFFFFFFFF;
}